

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryTracking.cpp
# Opt level: O1

void Memory::RecyclerMemoryTracking::ReportUnallocated
               (Recycler *recycler,void *address,void *endAddress,size_t sizeCat)

{
  return;
}

Assistant:

void RecyclerMemoryTracking::ReportUnallocated(Recycler * recycler, __in void* address, __in void *endAddress, size_t sizeCat)
{
    // Even though the memory is not really allocated between address and endAddress,
    // the recycler initially treats it as allocated and a ReportFree() will be called on it even
    // though ReportAllocation() is never called. This can be treated as equivalent of the parent
    // requesting the following be performed:
    //
    //  while (address + sizeCat <= endAddress)
    //  {
    //    ReportFree(address, sizeCat);
    //    address += sizeCat;
    //  }
    //
    // if address where a (char *)
}